

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

Arg * __thiscall
fmt::BasicFormatter<wchar_t>::get_arg
          (Arg *__return_storage_ptr__,BasicFormatter<wchar_t> *this,
          BasicStringRef<wchar_t> arg_name,char **error)

{
  undefined8 uVar1;
  undefined4 uVar2;
  char *pcVar3;
  Arg *pAVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  BasicStringRef<wchar_t> local_28;
  
  local_28.size_ = arg_name.size_;
  local_28.data_ = arg_name.data_;
  if ((this->super_FormatterBase).next_arg_index_ < 1) {
    (this->super_FormatterBase).next_arg_index_ = -1;
    internal::ArgMap<wchar_t>::init(&this->map_,(EVP_PKEY_CTX *)this);
    pAVar4 = internal::ArgMap<wchar_t>::find(&this->map_,&local_28);
    if (pAVar4 != (Arg *)0x0) {
      iVar5 = (pAVar4->super_Value).field_0.int_value;
      uVar6 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 4);
      uVar7 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 8);
      uVar8 = *(undefined4 *)((long)&(pAVar4->super_Value).field_0 + 0xc);
      uVar2 = *(undefined4 *)&pAVar4->field_0x14;
      uVar1 = *(undefined8 *)&pAVar4->field_0x18;
      __return_storage_ptr__->type = pAVar4->type;
      *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar2;
      *(undefined8 *)&__return_storage_ptr__->field_0x18 = uVar1;
      goto LAB_001e0c44;
    }
    pcVar3 = "argument not found";
  }
  else {
    pcVar3 = "cannot switch from automatic to manual argument indexing";
  }
  *error = pcVar3;
  iVar5 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar8 = 0;
  *(undefined8 *)&__return_storage_ptr__->type = 0;
  *(undefined8 *)&__return_storage_ptr__->field_0x18 = 0;
LAB_001e0c44:
  (__return_storage_ptr__->super_Value).field_0.int_value = iVar5;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 4) = uVar6;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 8) = uVar7;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 0xc) = uVar8;
  return __return_storage_ptr__;
}

Assistant:

inline Arg fmt::BasicFormatter<Char>::get_arg(
  BasicStringRef<Char> arg_name, const char *&error) {
  if (check_no_auto_index(error)) {
    map_.init(args());
    const Arg *arg = map_.find(arg_name);
    if (arg)
      return *arg;
    error = "argument not found";
  }
  return Arg();
}